

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::do_bind(Server *this)

{
  int iVar1;
  char *__cp;
  undefined1 local_20 [8];
  sockaddr_in serv_addr;
  Server *this_local;
  
  serv_addr.sin_zero = (uchar  [8])this;
  memset(local_20,0,0x10);
  local_20._0_2_ = 2;
  local_20._2_2_ = htons(this->port_no);
  __cp = (char *)std::__cxx11::string::c_str();
  local_20._4_4_ = inet_addr(__cp);
  iVar1 = bind(this->server_sock,(sockaddr *)local_20,0x10);
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x3d);
    fprintf(_stderr,"--> %s\n",
            "bind(this->server_sock, (struct sockaddr *) &serv_addr, sizeof(serv_addr))");
    perror("info");
    exit(1);
  }
  return;
}

Assistant:

void Server::do_bind() {
    struct sockaddr_in serv_addr;
    bzero((char *) &serv_addr, sizeof(serv_addr));
    serv_addr.sin_family = AF_INET;
    serv_addr.sin_port = htons(this->port_no);
    serv_addr.sin_addr.s_addr = inet_addr(this->server_addr.c_str());
    IF_NEGATIVE_EXIT(bind(this->server_sock, (struct sockaddr *) &serv_addr, sizeof(serv_addr)));
}